

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int properties_set_group_sequence(PROPERTIES_HANDLE properties,sequence_no group_sequence_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE group_sequence_amqp_value;
  PROPERTIES_INSTANCE *properties_instance;
  int result;
  sequence_no group_sequence_value_local;
  PROPERTIES_HANDLE properties_local;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    properties_instance._0_4_ = 0x4263;
  }
  else {
    item_value = amqpvalue_create_sequence_no(group_sequence_value);
    if (item_value == (AMQP_VALUE)0x0) {
      properties_instance._0_4_ = 0x426b;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(properties->composite_value,0xb,item_value);
      if (iVar1 == 0) {
        properties_instance._0_4_ = 0;
      }
      else {
        properties_instance._0_4_ = 0x4271;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)properties_instance;
}

Assistant:

int properties_set_group_sequence(PROPERTIES_HANDLE properties, sequence_no group_sequence_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE group_sequence_amqp_value = amqpvalue_create_sequence_no(group_sequence_value);
        if (group_sequence_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 11, group_sequence_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(group_sequence_amqp_value);
        }
    }

    return result;
}